

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_rowcol_blocked_sse41_128_32
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  longlong lVar2;
  ulong uVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  int segWidth_00;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  __m128i vH_00;
  int local_56c;
  int32_t value;
  __m128i vH_2;
  __m128i vH_1;
  __m128i vT2;
  __m128i vT1;
  __m128i vE;
  __m128i vH;
  __m128i vP;
  __m128i *pvP;
  __m128i vF;
  __m128i vX;
  __m128i_32_t e;
  __m128i_32_t h;
  int local_48c;
  longlong lStack_488;
  int32_t index_1;
  __m128i_32_t t;
  int local_46c;
  int local_468;
  int32_t index;
  int32_t position;
  int32_t offset;
  parasail_result_t *result;
  __m128i vMaxH;
  __m128i vNegInf;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  int score;
  __m128i *pvE;
  __m128i *pvH;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  int32_t n;
  int32_t segNum;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  
  iVar11 = s1Len + 3;
  if (s1Len + 3 < 0) {
    iVar11 = s1Len + 6;
  }
  iVar11 = iVar11 >> 2;
  segWidth_00 = open;
  ptr = parasail_memalign___m128i(0x10,(long)(iVar11 * 0x18));
  ptr_00 = parasail_memalign___m128i(0x10,(long)iVar11);
  ptr_01 = parasail_memalign___m128i(0x10,(long)iVar11);
  vGapO[1]._4_4_ = -0x40000000;
  vMaxH[1] = -0x3fffffff40000000;
  result = (parasail_result_t *)0x0;
  vMaxH[0] = 0;
  _position = parasail_result_new_rowcol1(iVar11 << 2,s2Len);
  index = iVar11 + -1;
  local_468 = s1Len % 4;
  local_46c = 0;
  for (n = 0; n < 0x18; n = n + 1) {
    for (k = 0; k < iVar11; k = k + 1) {
      segNum = k << 2;
      for (segWidth = 0; segWidth < 4; segWidth = segWidth + 1) {
        if (segNum < s1Len) {
          local_56c = matrix->matrix[matrix->size * matrix->mapper[(byte)s1[segNum]]];
        }
        else {
          local_56c = 0;
        }
        *(int *)((long)&stack0xfffffffffffffb78 + (long)segWidth * 4) = local_56c;
        segNum = segNum + 1;
      }
      ptr[local_46c][0] = lStack_488;
      ptr[local_46c][1] = t.m[0];
      local_46c = local_46c + 1;
    }
  }
  local_48c = 0;
  for (k = 0; k < iVar11; k = k + 1) {
    for (segWidth = 0; segWidth < 4; segWidth = segWidth + 1) {
      *(undefined4 *)((long)&e + (long)segWidth * 4 + 8) = 0;
      *(int *)((long)vX + (long)segWidth * 4 + 8) = -open;
    }
    ptr_00[local_48c][0] = e.m[1];
    ptr_00[local_48c][1] = h.m[0];
    ptr_01[local_48c][0] = vX[1];
    ptr_01[local_48c][1] = e.m[0];
    local_48c = local_48c + 1;
  }
  for (segNum = 0; segNum < s2Len; segNum = segNum + 1) {
    vF[1] = 0;
    vF[0] = 0xc0000000c0000000;
    pvP = (__m128i *)vMaxH[1];
    iVar1 = matrix->mapper[(byte)s2[segNum]];
    for (k = 0; vX[0] = 0, k < iVar11; k = k + 1) {
      lVar2 = ptr_00[k][0];
      uVar3 = ptr_00[k][1];
      lVar4 = ptr_01[k][0];
      lVar5 = ptr_01[k][1];
      lVar6 = ptr[(long)(iVar1 * iVar11) + (long)k][0];
      lVar7 = ptr[(long)(iVar1 * iVar11) + (long)k][1];
      local_258 = (int)vF[1];
      iStack_254 = (int)lVar2;
      iStack_250 = (int)((ulong)lVar2 >> 0x20);
      iStack_24c = (int)uVar3;
      local_268 = (int)lVar6;
      iStack_264 = (int)((ulong)lVar6 >> 0x20);
      iStack_260 = (int)lVar7;
      iStack_25c = (int)((ulong)lVar7 >> 0x20);
      local_258 = local_258 + local_268;
      iStack_254 = iStack_254 + iStack_264;
      iStack_250 = iStack_250 + iStack_260;
      iStack_24c = iStack_24c + iStack_25c;
      local_188 = (int)lVar4;
      iStack_184 = (int)((ulong)lVar4 >> 0x20);
      iStack_180 = (int)lVar5;
      iStack_17c = (int)((ulong)lVar5 >> 0x20);
      uVar12 = (uint)(local_258 < local_188) * local_188 |
               (uint)(local_258 >= local_188) * local_258;
      uVar14 = (uint)(iStack_254 < iStack_184) * iStack_184 |
               (uint)(iStack_254 >= iStack_184) * iStack_254;
      uVar15 = (uint)(iStack_250 < iStack_180) * iStack_180 |
               (uint)(iStack_250 >= iStack_180) * iStack_250;
      uVar17 = (uint)(iStack_24c < iStack_17c) * iStack_17c |
               (uint)(iStack_24c >= iStack_17c) * iStack_24c;
      vE[1]._0_4_ = (-1 < (int)uVar12) * uVar12;
      vE[1]._4_4_ = (-1 < (int)uVar14) * uVar14;
      vH[0]._0_4_ = (-1 < (int)uVar15) * uVar15;
      vH[0]._4_4_ = (-1 < (int)uVar17) * uVar17;
      iVar13 = pvP._12_4_ - open;
      pvP = (__m128i *)CONCAT44((uint)vE[1] - open,iVar13);
      vF[0]._0_4_ = vE[1]._4_4_ - open;
      vF[0]._4_4_ = (uint)vH[0] - open;
      uVar12 = -(uint)(0 < (int)((uint)vH[0] - open));
      auVar9._4_4_ = -(uint)(0 < (int)((uint)vE[1] - open));
      auVar9._0_4_ = -(uint)(0 < iVar13);
      auVar9._8_4_ = -(uint)(0 < (int)(vE[1]._4_4_ - open));
      auVar9._12_4_ = uVar12;
      if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar9 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar9 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar9 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar9 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar9 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar9 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar9 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (uVar12 >> 7 & 1) == 0) && (uVar12 >> 0xf & 1) == 0) && (uVar12 >> 0x17 & 1) == 0) &&
          -1 < (int)uVar12) {
        pvP._4_4_ = vE[1]._4_4_;
        pvP._0_4_ = (uint)vE[1];
        vF[0]._4_4_ = vH[0]._4_4_;
        vF[0]._0_4_ = (uint)vH[0];
      }
      else {
        vH_1[1] = (longlong)pvP;
        vT2[0] = vF[0];
        while( true ) {
          local_98 = (int)vH_1[1];
          iStack_94 = (int)((ulong)vH_1[1] >> 0x20);
          iStack_90 = (int)vT2[0];
          iStack_8c = (int)((ulong)vT2[0] >> 0x20);
          uVar12 = -(uint)(0 < iStack_8c);
          auVar8._4_4_ = -(uint)(0 < iStack_94);
          auVar8._0_4_ = -(uint)(0 < local_98);
          auVar8._8_4_ = -(uint)(0 < iStack_90);
          auVar8._12_4_ = uVar12;
          local_1b8 = (int)pvP;
          iStack_1b4 = pvP._4_4_;
          iStack_1b0 = pvP._8_4_;
          iStack_1ac = pvP._12_4_;
          if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar8 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar8 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar8 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar8 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar8 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar8 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar8 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar8 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (uVar12 >> 7 & 1) == 0) && (uVar12 >> 0xf & 1) == 0) && (uVar12 >> 0x17 & 1) == 0)
              && -1 < (int)uVar12) break;
          iVar13 = -gap;
          local_98 = local_98 - gap;
          iStack_94 = iStack_94 - gap;
          iStack_90 = iStack_90 - gap;
          vH_1[1] = CONCAT44(local_98,iVar13);
          vT2[0] = CONCAT44(iStack_90,iStack_94);
          pvP = (__m128i *)
                CONCAT44((uint)(iStack_1b4 < local_98) * local_98 |
                         (uint)(iStack_1b4 >= local_98) * iStack_1b4,
                         (uint)(local_1b8 < iVar13) * iVar13 |
                         (uint)(local_1b8 >= iVar13) * local_1b8);
          vF[0]._0_4_ = (uint)(iStack_1b0 < iStack_94) * iStack_94 |
                        (uint)(iStack_1b0 >= iStack_94) * iStack_1b0;
          vF[0]._4_4_ = (uint)(iStack_1ac < iStack_90) * iStack_90 |
                        (uint)(iStack_1ac >= iStack_90) * iStack_1ac;
        }
        vE[1]._0_4_ = (uint)((int)(uint)vE[1] < local_1b8) * local_1b8 |
                      ((int)(uint)vE[1] >= local_1b8) * (uint)vE[1];
        vE[1]._4_4_ = (uint)((int)vE[1]._4_4_ < iStack_1b4) * iStack_1b4 |
                      ((int)vE[1]._4_4_ >= iStack_1b4) * vE[1]._4_4_;
        vH[0]._0_4_ = (uint)((int)(uint)vH[0] < iStack_1b0) * iStack_1b0 |
                      ((int)(uint)vH[0] >= iStack_1b0) * (uint)vH[0];
        vH[0]._4_4_ = (uint)((int)vH[0]._4_4_ < iStack_1ac) * iStack_1ac |
                      ((int)vH[0]._4_4_ >= iStack_1ac) * vH[0]._4_4_;
        iVar13 = (iStack_1b4 + open) - gap;
        iVar16 = (iStack_1b0 + open) - gap;
        iVar18 = (iStack_1ac + open) - gap;
        auVar10._4_4_ =
             (uint)((int)(uint)vH[0] < iVar16) * iVar16 | ((int)(uint)vH[0] >= iVar16) * (uint)vH[0]
        ;
        auVar10._0_4_ =
             (uint)((int)vE[1]._4_4_ < iVar13) * iVar13 | ((int)vE[1]._4_4_ >= iVar13) * vE[1]._4_4_
        ;
        auVar10._8_4_ =
             (uint)((int)vH[0]._4_4_ < iVar18) * iVar18 | ((int)vH[0]._4_4_ >= iVar18) * vH[0]._4_4_
        ;
        auVar10._12_4_ = 0;
        _pvP = auVar10 << 0x20;
      }
      ptr_00[k][0] = CONCAT44(vE[1]._4_4_,(uint)vE[1]);
      ptr_00[k][1] = CONCAT44(vH[0]._4_4_,(uint)vH[0]);
      local_218 = (int)result;
      iStack_214 = (int)((ulong)result >> 0x20);
      iStack_210 = (int)vMaxH[0];
      iStack_20c = (int)((ulong)vMaxH[0] >> 0x20);
      result = (parasail_result_t *)
               CONCAT44((iStack_214 < (int)vE[1]._4_4_) * vE[1]._4_4_ |
                        (uint)(iStack_214 >= (int)vE[1]._4_4_) * iStack_214,
                        (local_218 < (int)(uint)vE[1]) * (uint)vE[1] |
                        (uint)(local_218 >= (int)(uint)vE[1]) * local_218);
      vMaxH[0] = CONCAT44((iStack_20c < (int)vH[0]._4_4_) * vH[0]._4_4_ |
                          (uint)(iStack_20c >= (int)vH[0]._4_4_) * iStack_20c,
                          (iStack_210 < (int)(uint)vH[0]) * (uint)vH[0] |
                          (uint)(iStack_210 >= (int)(uint)vH[0]) * iStack_210);
      iVar13 = (uint)vE[1] - open;
      iVar16 = vE[1]._4_4_ - open;
      iVar18 = (uint)vH[0] - open;
      iVar19 = vH[0]._4_4_ - open;
      local_188 = local_188 - gap;
      iStack_184 = iStack_184 - gap;
      iStack_180 = iStack_180 - gap;
      iStack_17c = iStack_17c - gap;
      vT1[1] = CONCAT44((uint)(iStack_184 < iVar16) * iVar16 |
                        (uint)(iStack_184 >= iVar16) * iStack_184,
                        (uint)(local_188 < iVar13) * iVar13 |
                        (uint)(local_188 >= iVar13) * local_188);
      vE[0] = CONCAT44((uint)(iStack_17c < iVar19) * iVar19 |
                       (uint)(iStack_17c >= iVar19) * iStack_17c,
                       (uint)(iStack_180 < iVar18) * iVar18 |
                       (uint)(iStack_180 >= iVar18) * iStack_180);
      ptr_01[k][0] = vT1[1];
      ptr_01[k][1] = vE[0];
      vF[1] = uVar3 >> 0x20;
    }
    vH_1[0] = ptr_00[index][1];
    vH_2[1] = ptr_00[index][0];
    for (n = 0; n < local_468; n = n + 1) {
      vH_1[0] = vH_1[0] << 0x10 | (ulong)vH_2[1] >> 0x30;
      vH_2[1] = vH_2[1] << 0x10;
    }
    ((_position->field_4).rowcols)->score_row[segNum] = (int)vH_1[0]._6_2_;
  }
  for (k = 0; k < iVar11; k = k + 1) {
    vH_00[0] = (ulong)(uint)k;
    vH_00[1] = 4;
    arr_store_col(((_position->field_4).rowcols)->score_col,vH_00,k * 0x10,segWidth_00);
  }
  for (segNum = 0; segNum < 4; segNum = segNum + 1) {
    if (vGapO[1]._4_4_ < vMaxH[0]._4_4_) {
      vGapO[1]._4_4_ = vMaxH[0]._4_4_;
    }
    vMaxH[0] = vMaxH[0] << 0x20 | (ulong)result >> 0x20;
    result = (parasail_result_t *)((long)result << 0x20);
  }
  _position->score = vGapO[1]._4_4_;
  _position->flag = _position->flag | 0x8202004;
  _position->flag = _position->flag | 0x40000;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return _position;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 4; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_32;
    __m128i vGapO = _mm_set1_epi32(open);
    __m128i vGapE = _mm_set1_epi32(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi32(NEG_INF_32);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_32_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 12); /* rshift 3 */
            vH = _mm_slli_si128(vH, 4); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi32(vH, vP);
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vZero);

            vF = _mm_srli_si128(vF, 12);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 4));
            vF = _mm_sub_epi32(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi32(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi32(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 4);
                    vT2 = _mm_sub_epi32(vT2, vGapE);
                    vF = _mm_max_epi32(vF, vT2);
                }
                vH = _mm_max_epi32(vH, vF);
                vF = _mm_add_epi32(vF, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                vF = _mm_max_epi32(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vMaxH, vH);

            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int32_t value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}